

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  string *local_130;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_128;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_108 [40];
  string local_e0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_c0;
  function<void()> local_a8 [32];
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tuple;
  undefined1 local_60 [48];
  
  nTimer_local = nTimer;
  local_130 = funcName;
  local_128 = func;
  if (nTimer < 0) {
    local_108._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_108);
  }
  std::__cxx11::string::string((string *)&tuple,(string *)args_1);
  tuple.
  super__Tuple_impl<0UL,_char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,std::__cxx11::string>(&chs,this,&tuple);
  local_108._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_108 + 8),(string *)from);
  std::__cxx11::string::string(local_e0,(string *)local_130);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_c0,&chs);
  local_60._0_8_ = local_128;
  local_60._8_8_ = *args;
  std::__cxx11::string::string((string *)(local_60 + 0x10),(string *)args_1);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&&)::_lambda()_1_,void>
            (local_a8,(anon_class_48_3_3bdf3dc2 *)local_60);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_108);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_108);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_130,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  std::__cxx11::string::~string((string *)&tuple);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}